

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O0

Error * ot::commissioner::security_material::GetNetworkSM
                  (Error *__return_storage_ptr__,string *aAlias,bool aNeedCert,bool aNeedPSKc,
                  SecurityMaterials *aSM)

{
  allocator local_49;
  string local_48;
  SecurityMaterials *local_28;
  SecurityMaterials *aSM_local;
  bool aNeedPSKc_local;
  string *psStack_18;
  bool aNeedCert_local;
  string *aAlias_local;
  
  local_28 = aSM;
  aSM_local._6_1_ = aNeedPSKc;
  aSM_local._7_1_ = aNeedCert;
  psStack_18 = aAlias;
  aAlias_local = (string *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nwk/",&local_49);
  GetNetworkSMImpl(__return_storage_ptr__,&local_48,psStack_18,(bool)(aSM_local._7_1_ & 1),
                   (bool)(aSM_local._6_1_ & 1),local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return __return_storage_ptr__;
}

Assistant:

Error GetNetworkSM(const std::string &aAlias, bool aNeedCert, bool aNeedPSKc, SecurityMaterials &aSM)
{
    return GetNetworkSMImpl("nwk/", aAlias, aNeedCert, aNeedPSKc, aSM);
}